

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# staleblock_test.cc
# Opt level: O3

void superblock_recovery_test(void)

{
  fdb_status s;
  fdb_status fVar1;
  sb_decision_t sVar2;
  uint uVar3;
  int iVar4;
  size_t sVar5;
  fdb_kvs_handle *pfVar6;
  fdb_file_info *unaff_RBP;
  ulong uVar7;
  char *pcVar8;
  fdb_encryption_key *unaff_R12;
  fdb_kvs_handle *unaff_R13;
  fdb_kvs_handle *unaff_R14;
  fdb_kvs_handle *handle;
  fdb_kvs_handle *handle_00;
  fdb_kvs_handle *unaff_R15;
  fdb_file_handle *dbfile;
  fdb_kvs_handle *db;
  fdb_snapshot_info_t *markers;
  void *rvalue;
  uint64_t num_markers;
  fdb_kvs_handle *snap_db;
  size_t rvalue_len;
  fdb_kvs_config kvs_config;
  timeval __test_begin;
  fdb_file_info file_info;
  fdb_config fconfig;
  char keybuf [256];
  char bodybuf [256];
  fdb_kvs_handle *pfStack_5a8;
  fdb_file_handle *pfStack_5a0;
  void *pvStack_598;
  char acStack_590 [24];
  size_t sStack_578;
  fdb_kvs_config fStack_570;
  timeval tStack_558;
  fdb_file_info fStack_548;
  fdb_config fStack_500;
  fdb_kvs_handle *pfStack_408;
  fdb_encryption_key *pfStack_400;
  fdb_kvs_handle *pfStack_3f8;
  fdb_kvs_handle *pfStack_3f0;
  fdb_kvs_handle *pfStack_3e8;
  fdb_file_info *pfStack_3e0;
  fdb_file_handle *local_3d8;
  fdb_kvs_handle *local_3d0;
  fdb_snapshot_info_t *local_3c8;
  fdb_kvs_handle *local_3c0;
  uint64_t local_3b8;
  fdb_kvs_handle *local_3b0;
  size_t local_3a8;
  fdb_kvs_config local_3a0;
  timeval local_388;
  fdb_file_info local_378;
  undefined1 local_330 [248];
  fdb_kvs_handle local_238;
  
  pfStack_3e0 = (fdb_file_info *)0x10e8ef;
  gettimeofday(&local_388,(__timezone_ptr_t)0x0);
  pfStack_3e0 = (fdb_file_info *)0x10e8f4;
  memleak_start();
  pfStack_3e0 = (fdb_file_info *)0x10e8fe;
  fdb_get_default_kvs_config();
  pfVar6 = (fdb_kvs_handle *)local_330;
  pfStack_3e0 = (fdb_file_info *)0x10e90e;
  fdb_get_default_config();
  pfStack_3e0 = (fdb_file_info *)0x10e91a;
  system("rm -rf  staleblktest* > errorlog.txt");
  pfStack_3e0 = (fdb_file_info *)0x10e92c;
  fVar1 = fdb_open(&local_3d8,"./staleblktest1",(fdb_config *)pfVar6);
  if (fVar1 == FDB_RESULT_SUCCESS) {
    pfStack_3e0 = (fdb_file_info *)0x10e94e;
    fVar1 = fdb_kvs_open(local_3d8,&local_3d0,"db",&local_3a0);
    if (fVar1 != FDB_RESULT_SUCCESS) goto LAB_0010ed02;
    unaff_R14 = (fdb_kvs_handle *)0x0;
    if (local_330._208_8_ != 0xffffffffffffffff) {
      unaff_R14 = (fdb_kvs_handle *)0x0;
      pfVar6 = &local_238;
      do {
        unaff_R15 = local_3d0;
        local_238.kvs_config.create_if_missing = true;
        local_238.kvs_config._1_3_ = 0x7965;
        pfStack_3e0 = (fdb_file_info *)0x10e987;
        sVar5 = strlen((char *)pfVar6);
        pfStack_3e0 = (fdb_file_info *)0x10e99a;
        fVar1 = fdb_set_kv(unaff_R15,pfVar6,sVar5,(void *)0x0,0);
        if (fVar1 != FDB_RESULT_SUCCESS) goto LAB_0010ecf4;
        pfStack_3e0 = (fdb_file_info *)0x10e9b0;
        fVar1 = fdb_commit(local_3d8,'\x01');
        if (fVar1 != FDB_RESULT_SUCCESS) goto LAB_0010eced;
        unaff_R14 = (fdb_kvs_handle *)&(unaff_R14->kvs_config).field_0x1;
      } while (unaff_R14 < (undefined1 *)(local_330._208_8_ + 1));
    }
    pfStack_3e0 = (fdb_file_info *)0x10e9d9;
    fVar1 = fdb_get_file_info(local_3d8,&local_378);
    if (fVar1 != FDB_RESULT_SUCCESS) goto LAB_0010ed09;
    unaff_R12 = &local_238.config.encryption_key;
    unaff_R13 = &local_238;
    unaff_RBP = &local_378;
    do {
      if (0xffffff < local_378.file_size) goto LAB_0010ea6e;
      local_238.kvs_config.create_if_missing = true;
      local_238.kvs_config._1_3_ = 0x7965;
      pfStack_3e0 = (fdb_file_info *)0x10ea23;
      sprintf((char *)unaff_R12,"body%d",(ulong)unaff_R14 & 0xffffffff);
      pfVar6 = local_3d0;
      pfStack_3e0 = (fdb_file_info *)0x10ea30;
      unaff_R15 = (fdb_kvs_handle *)strlen((char *)unaff_R13);
      pfStack_3e0 = (fdb_file_info *)0x10ea3b;
      sVar5 = strlen((char *)unaff_R12);
      pfStack_3e0 = (fdb_file_info *)0x10ea4f;
      fVar1 = fdb_set_kv(pfVar6,unaff_R13,(size_t)unaff_R15,unaff_R12,sVar5);
      if (fVar1 != FDB_RESULT_SUCCESS) {
        pfStack_3e0 = (fdb_file_info *)0x10eced;
        superblock_recovery_test();
LAB_0010eced:
        pfStack_3e0 = (fdb_file_info *)0x10ecf4;
        superblock_recovery_test();
LAB_0010ecf4:
        pfStack_3e0 = (fdb_file_info *)0x10ecfb;
        superblock_recovery_test();
        goto LAB_0010ecfb;
      }
      pfStack_3e0 = (fdb_file_info *)0x10ea63;
      fVar1 = fdb_get_file_info(local_3d8,unaff_RBP);
    } while (fVar1 == FDB_RESULT_SUCCESS);
    pfStack_3e0 = (fdb_file_info *)0x10ea6e;
    superblock_recovery_test();
LAB_0010ea6e:
    pfStack_3e0 = (fdb_file_info *)0x10ea78;
    sVar2 = sb_check_block_reusing(local_3d0);
    if (sVar2 != SBD_RECLAIM) {
      pfStack_3e0 = (fdb_file_info *)0x10ea87;
      superblock_recovery_test();
    }
    pfStack_3e0 = (fdb_file_info *)0x10ea91;
    fVar1 = fdb_kvs_close(local_3d0);
    if (fVar1 != FDB_RESULT_SUCCESS) goto LAB_0010ed10;
    pfStack_3e0 = (fdb_file_info *)0x10eaa2;
    fVar1 = fdb_close(local_3d8);
    if (fVar1 != FDB_RESULT_SUCCESS) goto LAB_0010ed17;
    pfStack_3e0 = (fdb_file_info *)0x10eaaf;
    uVar3 = fork();
    if (uVar3 == 0) goto LAB_0010ed1e;
    unaff_RBP = (fdb_file_info *)(ulong)uVar3;
    pfStack_3e0 = (fdb_file_info *)0x10eac3;
    sleep(3);
    pfStack_3e0 = (fdb_file_info *)0x10eacf;
    kill(uVar3,10);
    pfStack_3e0 = (fdb_file_info *)0x10eae6;
    fVar1 = fdb_open(&local_3d8,"./staleblktest1",(fdb_config *)local_330);
    if (fVar1 != FDB_RESULT_SUCCESS) goto LAB_0010ed23;
    pfStack_3e0 = (fdb_file_info *)0x10eb08;
    fVar1 = fdb_kvs_open(local_3d8,&local_3d0,"db",&local_3a0);
    handle = local_3d0;
    if (fVar1 != FDB_RESULT_SUCCESS) goto LAB_0010ed2a;
    pfVar6 = &local_238;
    local_238.kvs_config._4_1_ = 0;
    local_238.kvs_config.create_if_missing = true;
    local_238.kvs_config._1_3_ = 0x307965;
    pfStack_3e0 = (fdb_file_info *)0x10eb2f;
    sVar5 = strlen((char *)pfVar6);
    pfStack_3e0 = (fdb_file_info *)0x10eb47;
    fVar1 = fdb_get_kv(handle,pfVar6,sVar5,&local_3c0,&local_3a8);
    if (fVar1 != FDB_RESULT_SUCCESS) goto LAB_0010ed31;
    pfStack_3e0 = (fdb_file_info *)0x10eb59;
    fVar1 = fdb_free_block(local_3c0);
    if (fVar1 != FDB_RESULT_SUCCESS) goto LAB_0010ed38;
    pfStack_3e0 = (fdb_file_info *)0x10eb74;
    fVar1 = fdb_get_all_snap_markers(local_3d8,&local_3c8,&local_3b8);
    if (fVar1 != FDB_RESULT_SUCCESS) goto LAB_0010ed3f;
    if (local_3b8 != local_330._208_8_) {
      pfStack_3e0 = (fdb_file_info *)0x10eb9d;
      superblock_recovery_test();
    }
    pfStack_3e0 = (fdb_file_info *)0x10ebb1;
    fVar1 = fdb_compact_upto(local_3d8,(char *)0x0,local_3c8[4].marker);
    if (fVar1 != FDB_RESULT_SUCCESS) goto LAB_0010ed44;
    pfStack_3e0 = (fdb_file_info *)0x10ebd5;
    fVar1 = fdb_snapshot_open(local_3d0,&local_3b0,(local_3c8[4].kvs_markers)->seqnum);
    if (fVar1 != FDB_RESULT_SUCCESS) goto LAB_0010ed49;
    pfStack_3e0 = (fdb_file_info *)0x10ebec;
    fVar1 = fdb_free_snap_markers(local_3c8,local_3b8);
    handle_00 = local_3b0;
    if (fVar1 != FDB_RESULT_SUCCESS) goto LAB_0010ed50;
    pfVar6 = &local_238;
    local_238.kvs_config._4_1_ = 0;
    local_238.kvs_config.create_if_missing = true;
    local_238.kvs_config._1_3_ = 0x307965;
    pfStack_3e0 = (fdb_file_info *)0x10ec13;
    sVar5 = strlen((char *)pfVar6);
    pfStack_3e0 = (fdb_file_info *)0x10ec2b;
    fVar1 = fdb_get_kv(handle_00,pfVar6,sVar5,&local_3c0,&local_3a8);
    if (fVar1 != FDB_RESULT_SUCCESS) goto LAB_0010ed55;
    pfStack_3e0 = (fdb_file_info *)0x10ec4c;
    iVar4 = bcmp(local_3c0,"seqno0",local_3a8);
    pfVar6 = local_3c0;
    if (iVar4 != 0) goto LAB_0010ed5c;
    pfStack_3e0 = (fdb_file_info *)0x10ec5c;
    fVar1 = fdb_free_block(local_3c0);
    if (fVar1 != FDB_RESULT_SUCCESS) goto LAB_0010ed61;
    pfStack_3e0 = (fdb_file_info *)0x10ec6e;
    fVar1 = fdb_kvs_close(local_3b0);
    if (fVar1 != FDB_RESULT_SUCCESS) goto LAB_0010ed68;
    pfStack_3e0 = (fdb_file_info *)0x10ec80;
    fVar1 = fdb_kvs_close(local_3d0);
    if (fVar1 != FDB_RESULT_SUCCESS) goto LAB_0010ed6f;
    pfStack_3e0 = (fdb_file_info *)0x10ec91;
    fVar1 = fdb_close(local_3d8);
    if (fVar1 == FDB_RESULT_SUCCESS) {
      pfStack_3e0 = (fdb_file_info *)0x10ec9e;
      fdb_shutdown();
      pfStack_3e0 = (fdb_file_info *)0x10eca3;
      memleak_end();
      pcVar8 = "%s PASSED\n";
      if (superblock_recovery_test()::__test_pass != '\0') {
        pcVar8 = "%s FAILED\n";
      }
      pfStack_3e0 = (fdb_file_info *)0x10ecd4;
      fprintf(_stderr,pcVar8,"superblock recovery test");
      return;
    }
  }
  else {
LAB_0010ecfb:
    pfStack_3e0 = (fdb_file_info *)0x10ed02;
    superblock_recovery_test();
LAB_0010ed02:
    pfStack_3e0 = (fdb_file_info *)0x10ed09;
    superblock_recovery_test();
LAB_0010ed09:
    pfStack_3e0 = (fdb_file_info *)0x10ed10;
    superblock_recovery_test();
LAB_0010ed10:
    pfStack_3e0 = (fdb_file_info *)0x10ed17;
    superblock_recovery_test();
LAB_0010ed17:
    pfStack_3e0 = (fdb_file_info *)0x10ed1e;
    superblock_recovery_test();
LAB_0010ed1e:
    pfStack_3e0 = (fdb_file_info *)0x10ed23;
    child_function();
LAB_0010ed23:
    pfStack_3e0 = (fdb_file_info *)0x10ed2a;
    superblock_recovery_test();
LAB_0010ed2a:
    handle = unaff_R14;
    pfStack_3e0 = (fdb_file_info *)0x10ed31;
    superblock_recovery_test();
LAB_0010ed31:
    pfStack_3e0 = (fdb_file_info *)0x10ed38;
    superblock_recovery_test();
LAB_0010ed38:
    pfStack_3e0 = (fdb_file_info *)0x10ed3f;
    superblock_recovery_test();
LAB_0010ed3f:
    pfStack_3e0 = (fdb_file_info *)0x10ed44;
    superblock_recovery_test();
LAB_0010ed44:
    pfStack_3e0 = (fdb_file_info *)0x10ed49;
    superblock_recovery_test();
LAB_0010ed49:
    pfStack_3e0 = (fdb_file_info *)0x10ed50;
    superblock_recovery_test();
LAB_0010ed50:
    handle_00 = handle;
    pfStack_3e0 = (fdb_file_info *)0x10ed55;
    superblock_recovery_test();
LAB_0010ed55:
    pfStack_3e0 = (fdb_file_info *)0x10ed5c;
    superblock_recovery_test();
LAB_0010ed5c:
    pfStack_3e0 = (fdb_file_info *)0x10ed61;
    superblock_recovery_test();
LAB_0010ed61:
    pfStack_3e0 = (fdb_file_info *)0x10ed68;
    superblock_recovery_test();
LAB_0010ed68:
    pfStack_3e0 = (fdb_file_info *)0x10ed6f;
    superblock_recovery_test();
LAB_0010ed6f:
    pfStack_3e0 = (fdb_file_info *)0x10ed76;
    superblock_recovery_test();
  }
  pfStack_3e0 = (fdb_file_info *)reclaim_rollback_point_test;
  superblock_recovery_test();
  pfStack_408 = pfVar6;
  pfStack_400 = unaff_R12;
  pfStack_3f8 = unaff_R13;
  pfStack_3f0 = handle_00;
  pfStack_3e8 = unaff_R15;
  pfStack_3e0 = unaff_RBP;
  memleak_start();
  gettimeofday(&tStack_558,(__timezone_ptr_t)0x0);
  fdb_get_default_config();
  fdb_get_default_kvs_config();
  system("rm -rf  staleblktest* > errorlog.txt");
  fStack_500.compaction_threshold = '\0';
  fStack_500.num_keeping_headers = 5;
  fVar1 = fdb_open(&pfStack_5a0,"./staleblktest1",&fStack_500);
  if (fVar1 != FDB_RESULT_SUCCESS) goto LAB_0010f20b;
  fVar1 = fdb_kvs_open(pfStack_5a0,&pfStack_5a8,"db",&fStack_570);
  if (fVar1 != FDB_RESULT_SUCCESS) goto LAB_0010f212;
  uVar7 = 0;
  do {
    sprintf(acStack_590,"key%d",uVar7);
    pfVar6 = pfStack_5a8;
    sVar5 = strlen(acStack_590);
    fVar1 = fdb_set_kv(pfVar6,acStack_590,sVar5,"reu",4);
    if (fVar1 != FDB_RESULT_SUCCESS) {
      reclaim_rollback_point_test();
      goto LAB_0010f1cc;
    }
    uVar3 = (int)uVar7 + 1;
    uVar7 = (ulong)uVar3;
  } while (uVar3 != 30000);
  fVar1 = fdb_commit(pfStack_5a0,'\x01');
  if (fVar1 != FDB_RESULT_SUCCESS) goto LAB_0010f219;
  do {
    fVar1 = fdb_set_kv(pfStack_5a8,"key",4,"val",4);
    if (fVar1 != FDB_RESULT_SUCCESS) goto LAB_0010f1d3;
    fVar1 = fdb_get_file_info(pfStack_5a0,&fStack_548);
    if (fVar1 != FDB_RESULT_SUCCESS) goto LAB_0010f1cc;
  } while (fStack_548.file_size < 0x1000001);
  fVar1 = fdb_commit(pfStack_5a0,'\x01');
  if (fVar1 != FDB_RESULT_SUCCESS) goto LAB_0010f220;
  uVar3 = 0;
  do {
    sprintf(acStack_590,"key%d",(ulong)uVar3);
    pfVar6 = pfStack_5a8;
    sVar5 = strlen(acStack_590);
    fVar1 = fdb_set_kv(pfVar6,acStack_590,sVar5,"reu2",5);
    if (fVar1 != FDB_RESULT_SUCCESS) goto LAB_0010f1da;
    uVar3 = uVar3 + 1;
  } while (uVar3 != 30000);
  fVar1 = fdb_commit(pfStack_5a0,'\x01');
  if (fVar1 != FDB_RESULT_SUCCESS) goto LAB_0010f227;
  fVar1 = fdb_rollback(&pfStack_5a8,30000);
  if (fVar1 != FDB_RESULT_SUCCESS) goto LAB_0010f22e;
  uVar3 = 0;
  do {
    sprintf(acStack_590,"key%d",(ulong)uVar3);
    pfVar6 = pfStack_5a8;
    sVar5 = strlen(acStack_590);
    fVar1 = fdb_get_kv(pfVar6,acStack_590,sVar5,&pvStack_598,&sStack_578);
    if (fVar1 != FDB_RESULT_SUCCESS) goto LAB_0010f1e1;
    free(pvStack_598);
    uVar3 = uVar3 + 1;
  } while (uVar3 != 30000);
  uVar3 = 0;
  do {
    sprintf(acStack_590,"key%d",(ulong)uVar3);
    pfVar6 = pfStack_5a8;
    sVar5 = strlen(acStack_590);
    fVar1 = fdb_set_kv(pfVar6,acStack_590,sVar5,"reu",4);
    if (fVar1 != FDB_RESULT_SUCCESS) goto LAB_0010f1ef;
    fVar1 = fdb_commit(pfStack_5a0,'\x01');
    if (fVar1 != FDB_RESULT_SUCCESS) goto LAB_0010f1e8;
    uVar3 = uVar3 + 1;
  } while (uVar3 != 5);
  iVar4 = 30000;
  do {
    fVar1 = fdb_set_kv(pfStack_5a8,"key",4,"val",4);
    if (fVar1 != FDB_RESULT_SUCCESS) goto LAB_0010f1f6;
    iVar4 = iVar4 + -1;
  } while (iVar4 != 0);
  fVar1 = fdb_commit(pfStack_5a0,'\x01');
  if (fVar1 != FDB_RESULT_SUCCESS) goto LAB_0010f235;
  iVar4 = 30000;
  do {
    fVar1 = fdb_set_kv(pfStack_5a8,"key",4,"val",4);
    if (fVar1 != FDB_RESULT_SUCCESS) goto LAB_0010f1fd;
    iVar4 = iVar4 + -1;
  } while (iVar4 != 0);
  fVar1 = fdb_commit(pfStack_5a0,'\x01');
  if (fVar1 != FDB_RESULT_SUCCESS) goto LAB_0010f23c;
  uVar3 = 0;
  do {
    sprintf(acStack_590,"key%d",(ulong)uVar3);
    pfVar6 = pfStack_5a8;
    sVar5 = strlen(acStack_590);
    fVar1 = fdb_get_kv(pfVar6,acStack_590,sVar5,&pvStack_598,&sStack_578);
    if (fVar1 != FDB_RESULT_SUCCESS) goto LAB_0010f204;
    free(pvStack_598);
    uVar3 = uVar3 + 1;
  } while (uVar3 != 30000);
  fVar1 = fdb_kvs_close(pfStack_5a8);
  if (fVar1 == FDB_RESULT_SUCCESS) {
    fVar1 = fdb_close(pfStack_5a0);
    if (fVar1 == FDB_RESULT_SUCCESS) {
      fdb_shutdown();
      memleak_end();
      pcVar8 = "%s PASSED\n";
      if (reclaim_rollback_point_test()::__test_pass != '\0') {
        pcVar8 = "%s FAILED\n";
      }
      fprintf(_stderr,pcVar8,"reclaim rollback point test");
      return;
    }
    goto LAB_0010f24a;
  }
  goto LAB_0010f243;
LAB_0010f1cc:
  reclaim_rollback_point_test();
LAB_0010f1d3:
  reclaim_rollback_point_test();
LAB_0010f1da:
  reclaim_rollback_point_test();
LAB_0010f1e1:
  reclaim_rollback_point_test();
LAB_0010f1e8:
  reclaim_rollback_point_test();
LAB_0010f1ef:
  reclaim_rollback_point_test();
LAB_0010f1f6:
  reclaim_rollback_point_test();
LAB_0010f1fd:
  reclaim_rollback_point_test();
LAB_0010f204:
  reclaim_rollback_point_test();
LAB_0010f20b:
  reclaim_rollback_point_test();
LAB_0010f212:
  reclaim_rollback_point_test();
LAB_0010f219:
  reclaim_rollback_point_test();
LAB_0010f220:
  reclaim_rollback_point_test();
LAB_0010f227:
  reclaim_rollback_point_test();
LAB_0010f22e:
  reclaim_rollback_point_test();
LAB_0010f235:
  reclaim_rollback_point_test();
LAB_0010f23c:
  reclaim_rollback_point_test();
LAB_0010f243:
  reclaim_rollback_point_test();
LAB_0010f24a:
  reclaim_rollback_point_test();
  verify_stale_block_reuse_test();
  verify_staleblock_reuse_param_test();
  reuse_with_snapshot_test();
  verify_minimum_num_keeping_headers_param_test();
  verify_high_num_keeping_headers_param_test();
  snapshot_before_block_reuse_test(false);
  snapshot_before_block_reuse_test(true);
  snapshot_after_block_reuse_test();
  variable_value_size_test();
  rollback_with_num_keeping_headers();
  reuse_on_delete_test();
  fragmented_reuse_test();
  enter_reuse_via_separate_kvs_test();
  superblock_recovery_test();
  crash_and_recover_with_num_keeping_test();
  reclaim_rollback_point_test();
  return;
}

Assistant:

void superblock_recovery_test() {
    TEST_INIT();
    memleak_start();

    int r;
    uint64_t i, num_markers;
    void *rvalue;
    size_t rvalue_len;
    char keybuf[256];
    char bodybuf[256];
    pid_t child_id;

    fdb_seqnum_t seqno;
    fdb_file_handle *dbfile;
    fdb_kvs_handle *db, *snap_db;
    fdb_snapshot_info_t *markers;
    fdb_status status;
    fdb_kvs_config kvs_config = fdb_get_default_kvs_config();
    fdb_config fconfig = fdb_get_default_config();
    fdb_file_info file_info;

    // remove previous staleblktest files
    r = system(SHELL_DEL" staleblktest* > errorlog.txt");
    (void)r;

    status = fdb_open(&dbfile, "./staleblktest1", &fconfig);
    TEST_STATUS(status);
    status = fdb_kvs_open(dbfile, &db, "db", &kvs_config);
    TEST_STATUS(status);

    // load until exceeding SB_MIN_BLOCK_REUSING_FILESIZE
    for (i = 0; i < fconfig.num_keeping_headers + 1; i++) {
        sprintf(keybuf, "key");
        status = fdb_set_kv(db, keybuf, strlen(keybuf), NULL, 0);
        TEST_STATUS(status);
        status = fdb_commit(dbfile, FDB_COMMIT_MANUAL_WAL_FLUSH);
        TEST_STATUS(status);
    }

    status = fdb_get_file_info(dbfile, &file_info);
    TEST_STATUS(status);

    while (file_info.file_size < SB_MIN_BLOCK_REUSING_FILESIZE) {
        sprintf(keybuf, "key");
        sprintf(bodybuf, "body%d", static_cast<int>(i));
        status = fdb_set_kv(db, keybuf, strlen(keybuf),
                            bodybuf, strlen(bodybuf));
        TEST_STATUS(status);
        status = fdb_get_file_info(dbfile, &file_info);
        TEST_STATUS(status);
    };

    TEST_CHK(sb_check_block_reusing(db) == SBD_RECLAIM);

    // close previous handle
    status = fdb_kvs_close(db);
    TEST_STATUS(status);
    status = fdb_close(dbfile);
    TEST_STATUS(status);

    // fork child
    child_id = fork();

    if (child_id == 0) {
        child_function();
    }

    // wait 3s
    sleep(3);

    // kill child
    kill(child_id, SIGUSR1);
    // reopen and recover

    status = fdb_open(&dbfile, "./staleblktest1", &fconfig);
    TEST_STATUS(status);
    status = fdb_kvs_open(dbfile, &db, "db", &kvs_config);
    TEST_STATUS(status);

    // get known key
    sprintf(keybuf, "key0");
    status = fdb_get_kv(db, keybuf, strlen(keybuf), &rvalue, &rvalue_len);
    TEST_STATUS(status);
    status = fdb_free_block(rvalue);
    TEST_STATUS(status);

    // compact upto marker
    status = fdb_get_all_snap_markers(dbfile, &markers, &num_markers);
    TEST_CHK(status == FDB_RESULT_SUCCESS);
    TEST_CHK(num_markers == fconfig.num_keeping_headers);
    status = fdb_compact_upto(dbfile, NULL, markers[4].marker);
    TEST_CHK(status == FDB_RESULT_SUCCESS);

    // open snapshot on marker
    seqno = markers[4].kvs_markers->seqnum;
    status = fdb_snapshot_open(db, &snap_db, seqno);
    TEST_STATUS(status);

    status = fdb_free_snap_markers(markers, num_markers);
    TEST_CHK(status == FDB_RESULT_SUCCESS);

    // get known key
    sprintf(keybuf, "key0");
    status = fdb_get_kv(snap_db, keybuf, strlen(keybuf), &rvalue, &rvalue_len);
    TEST_STATUS(status);

    // check value
    TEST_CMP(rvalue, "seqno0", rvalue_len);
    status = fdb_free_block(rvalue);
    TEST_STATUS(status);

    status = fdb_kvs_close(snap_db);
    TEST_STATUS(status);
    status = fdb_kvs_close(db);
    TEST_STATUS(status);
    status = fdb_close(dbfile);
    TEST_STATUS(status);
    fdb_shutdown();

    memleak_end();
    TEST_RESULT("superblock recovery test");
}